

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

uint64_t kratos::hash_var(Var *var)

{
  VarType VVar1;
  _func_int **pp_Var2;
  uint uVar3;
  uint64_t uVar4;
  _func_int **pp_Var5;
  Const *c;
  ulong uVar6;
  void *local_48;
  uint64_t local_40;
  
  pp_Var5 = (_func_int **)0x0;
  uVar6 = 0;
  do {
    if (var == (Var *)0x0) {
LAB_0021a2ec:
      return (ulong)pp_Var5 ^ uVar6;
    }
    VVar1 = var->type_;
    if (VVar1 != Expression) {
      if (VVar1 == ConstValue) {
        pp_Var5 = var[1].super_IRNode._vptr_IRNode;
      }
      else {
        if (VVar1 == Parameter) {
          (*(var->super_IRNode)._vptr_IRNode[0x1f])(&local_48,var);
          pp_Var5 = (_func_int **)hash_64_fnv1a(local_48,local_40);
        }
        else {
          (*(var->super_IRNode)._vptr_IRNode[0x1f])(&local_48,var);
          pp_Var5 = (_func_int **)hash_64_fnv1a(local_48,local_40);
          if (var->width_param_ == (Var *)0x0) {
            uVar3 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
            pp_Var5 = (_func_int **)((ulong)pp_Var5 ^ (ulong)uVar3);
          }
        }
        std::__cxx11::string::~string((string *)&local_48);
      }
      goto LAB_0021a2ec;
    }
    pp_Var2 = var[1].super_IRNode._vptr_IRNode;
    uVar4 = hash_var((Var *)var[1].super_IRNode.fn_name_ln.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    var = (Var *)var[1].super_IRNode.fn_name_ln.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (ulong)pp_Var2 ^ uVar6 ^ uVar4;
  } while( true );
}

Assistant:

static uint64_t hash_var(Var* var) {
    if (!var) return 0;
    if (var->type() == VarType::Expression) {
        auto* expr = reinterpret_cast<Expr*>(var);
        auto op_hash = (uint64_t)expr->op;
        return hash_var(expr->left) ^ hash_var(expr->right) ^ op_hash;
    } else if (var->type() == VarType::ConstValue) {
        auto* c = reinterpret_cast<Const*>(var);
        return static_cast<uint64_t>(c->value());
    } else if (var->type() == VarType::Parameter) {
        auto v = var->to_string();
        return hash_64_fnv1a(v.c_str(), v.size());
    } else {
        auto v = var->to_string();
        auto hash = hash_64_fnv1a(v.c_str(), v.size());
        if (!var->parametrized()) {
            hash ^= var->width();
        }
        return hash;
    }
}